

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metamakefile.cpp
# Opt level: O0

void __thiscall SubdirsMetaMakefileGenerator::Subdir::~Subdir(Subdir *this)

{
  long in_RDI;
  
  if (*(long **)(in_RDI + 0x48) != (long *)0x0) {
    (**(code **)(**(long **)(in_RDI + 0x48) + 8))();
  }
  QString::~QString((QString *)0x1d84dd);
  QString::~QString((QString *)0x1d84ea);
  QString::~QString((QString *)0x1d84f3);
  return;
}

Assistant:

~Subdir() { delete makefile; }